

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threshold.cpp
# Opt level: O2

int __thiscall ncnn::Threshold::forward_inplace(Threshold *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  int i;
  ulong uVar8;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar6 = bottom_top_blob->data;
  sVar1 = bottom_top_blob->cstep;
  sVar2 = bottom_top_blob->elemsize;
  uVar7 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar7;
  }
  uVar5 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar5 = uVar7;
  }
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      *(uint *)((long)pvVar6 + uVar8 * 4) =
           -(uint)(this->threshold < *(float *)((long)pvVar6 + uVar8 * 4)) & 0x3f800000;
    }
    pvVar6 = (void *)((long)pvVar6 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int Threshold::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] > threshold ? 1.f : 0.f;
        }
    }

    return 0;
}